

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBB.cpp
# Opt level: O1

void __thiscall
chrono::collision::CHOBB::FitToGeometries
          (CHOBB *this,ChMatrix33<double> *O,
          vector<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
          *mgeos,int firstgeo,int ngeos,double envelope)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ChGeometry *this_00;
  double dVar7;
  double dVar8;
  double dVar9;
  ulong uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ChVector<double> cmax;
  ChVector<double> cmin;
  ChVector<double> local_68;
  ChVector<double> local_50;
  double local_38;
  
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
  local_50.m_data[0] = 1.79769313486232e+308;
  local_50.m_data[1] = 1.79769313486232e+308;
  local_50.m_data[2] = 1.79769313486232e+308;
  local_68.m_data[0] = -1.79769313486232e+308;
  local_68.m_data[1] = -1.79769313486232e+308;
  local_68.m_data[2] = -1.79769313486232e+308;
  local_38 = envelope;
  if (0 < ngeos) {
    lVar11 = (long)firstgeo;
    uVar10 = (ulong)(uint)ngeos;
    do {
      this_00 = (mgeos->
                super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
                )._M_impl.super__Vector_impl_data._M_start[lVar11];
      if (this_00 != (ChGeometry *)0x0) {
        geometry::ChGeometry::InflateBoundingBox(this_00,&local_50,&local_68,&this->Rot);
      }
      lVar11 = lVar11 + 1;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  dVar7 = (local_50.m_data[2] + local_68.m_data[2]) * 0.5;
  dVar8 = (local_50.m_data[0] + local_68.m_data[0]) * 0.5;
  dVar9 = (local_50.m_data[1] + local_68.m_data[1]) * 0.5;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar8;
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       dVar9 * (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [7];
  auVar1 = vfmadd231sd_fma(auVar17,auVar14,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar7;
  auVar1 = vfmadd231sd_fma(auVar1,auVar12,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       dVar9 * (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
  auVar2 = vfmadd231sd_fma(auVar18,auVar14,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar2 = vfmadd231sd_fma(auVar2,auVar12,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar8;
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       dVar9 * (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
  auVar3 = vfmadd231sd_fma(auVar16,auVar15,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar7;
  auVar3 = vfmadd231sd_fma(auVar3,auVar13,auVar6);
  (this->To).m_data[0] = auVar3._0_8_;
  (this->To).m_data[1] = auVar2._0_8_;
  (this->To).m_data[2] = auVar1._0_8_;
  (this->d).m_data[0] = (local_68.m_data[0] - local_50.m_data[0]) * 0.5 + local_38;
  (this->d).m_data[1] = (local_68.m_data[1] - local_50.m_data[1]) * 0.5 + local_38;
  (this->d).m_data[2] = (local_68.m_data[2] - local_50.m_data[2]) * 0.5 + local_38;
  return;
}

Assistant:

void CHOBB::FitToGeometries(ChMatrix33<>& O,
                            std::vector<geometry::ChGeometry*> mgeos,
                            int firstgeo,
                            int ngeos,
                            double envelope) {
    // store orientation

    this->Rot = ChMatrix33<>(1);

    ChVector<> cmin(+std::numeric_limits<double>::max());
    ChVector<> cmax(-std::numeric_limits<double>::max());

    geometry::ChGeometry* nit;
    for (int count = 0; count < ngeos; ++count) {
        nit = mgeos[firstgeo + count];
        if (nit) {
            nit->InflateBoundingBox(cmin, cmax, Rot);
        }
    }

    ChVector<> c = (cmin + cmax) / 2;
    To = Rot * c;

    d = (cmax - cmin) / 2 + ChVector<>(envelope);
}